

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

void __thiscall World::clean_unused_blocksets(World *this)

{
  Blockset *pBVar1;
  value_type pBVar2;
  size_t this_00;
  bool bVar3;
  Blockset *pBVar4;
  size_type sVar5;
  reference this_01;
  size_type sVar6;
  reference ppBVar7;
  vector<Blockset_*,_std::allocator<Blockset_*>_> *blockset_group_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>
  *__range1_2;
  __normal_iterator<Blockset_**,_std::vector<Blockset_*,_std::allocator<Blockset_*>_>_> local_e0;
  __normal_iterator<Blockset_**,_std::vector<Blockset_*,_std::allocator<Blockset_*>_>_> local_d8;
  const_iterator local_d0;
  value_type local_c8;
  Blockset *blockset;
  size_t j;
  vector<Blockset_*,_std::allocator<Blockset_*>_> *blockset_group;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>
  *__range1_1;
  Blockset *local_78;
  type *local_70;
  type *map;
  type *id;
  _Self local_58;
  iterator __end1;
  iterator __begin1;
  map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
  *__range1;
  set<Blockset_*,_std::less<Blockset_*>,_std::allocator<Blockset_*>_> used_blocksets;
  World *this_local;
  
  used_blocksets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::set<Blockset_*,_std::less<Blockset_*>,_std::allocator<Blockset_*>_>::set
            ((set<Blockset_*,_std::less<Blockset_*>,_std::allocator<Blockset_*>_> *)&__range1);
  __end1 = std::
           map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
           ::begin(&this->_maps);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
       ::end(&this->_maps);
  while( true ) {
    bVar3 = std::operator==(&__end1,&local_58);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    id = &std::_Rb_tree_iterator<std::pair<const_unsigned_short,_Map_*>_>::operator*(&__end1)->first
    ;
    map = (type *)std::get<0ul,unsigned_short_const,Map*>((pair<const_unsigned_short,_Map_*> *)id);
    local_70 = std::get<1ul,unsigned_short_const,Map*>((pair<const_unsigned_short,_Map_*> *)id);
    local_78 = Map::blockset(*local_70);
    std::set<Blockset_*,_std::less<Blockset_*>,_std::allocator<Blockset_*>_>::insert
              ((set<Blockset_*,_std::less<Blockset_*>,_std::allocator<Blockset_*>_> *)&__range1,
               &local_78);
    std::_Rb_tree_iterator<std::pair<const_unsigned_short,_Map_*>_>::operator++(&__end1);
  }
  __end1_1 = std::
             vector<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>
             ::begin(&this->_blockset_groups);
  blockset_group =
       (vector<Blockset_*,_std::allocator<Blockset_*>_> *)
       std::
       vector<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>
       ::end(&this->_blockset_groups);
  while( true ) {
    bVar3 = __gnu_cxx::
            operator==<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_*,_std::vector<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>_>
                      (&__end1_1,
                       (__normal_iterator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_*,_std::vector<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>_>
                        *)&blockset_group);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    j = (size_t)__gnu_cxx::
                __normal_iterator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_*,_std::vector<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>_>
                ::operator*(&__end1_1);
    blockset = (Blockset *)0x1;
    while( true ) {
      pBVar1 = blockset;
      pBVar4 = (Blockset *)
               std::vector<Blockset_*,_std::allocator<Blockset_*>_>::size
                         ((vector<Blockset_*,_std::allocator<Blockset_*>_> *)j);
      if (pBVar4 <= pBVar1) break;
      ppBVar7 = std::vector<Blockset_*,_std::allocator<Blockset_*>_>::operator[]
                          ((vector<Blockset_*,_std::allocator<Blockset_*>_> *)j,(size_type)blockset)
      ;
      local_c8 = *ppBVar7;
      sVar5 = std::set<Blockset_*,_std::less<Blockset_*>,_std::allocator<Blockset_*>_>::count
                        ((set<Blockset_*,_std::less<Blockset_*>,_std::allocator<Blockset_*>_> *)
                         &__range1,&local_c8);
      this_00 = j;
      if (sVar5 == 0) {
        local_e0._M_current =
             (Blockset **)
             std::vector<Blockset_*,_std::allocator<Blockset_*>_>::begin
                       ((vector<Blockset_*,_std::allocator<Blockset_*>_> *)j);
        local_d8 = __gnu_cxx::
                   __normal_iterator<Blockset_**,_std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>
                   ::operator+(&local_e0,(long)(int)blockset);
        __gnu_cxx::
        __normal_iterator<Blockset*const*,std::vector<Blockset*,std::allocator<Blockset*>>>::
        __normal_iterator<Blockset**>
                  ((__normal_iterator<Blockset*const*,std::vector<Blockset*,std::allocator<Blockset*>>>
                    *)&local_d0,&local_d8);
        std::vector<Blockset_*,_std::allocator<Blockset_*>_>::erase
                  ((vector<Blockset_*,_std::allocator<Blockset_*>_> *)this_00,local_d0);
        pBVar2 = local_c8;
        if (local_c8 != (Blockset *)0x0) {
          Blockset::~Blockset(local_c8);
          operator_delete(pBVar2,0x18);
        }
        blockset = (Blockset *)
                   ((long)&blockset[-1]._blocks.
                           super__Vector_base<std::array<Tile,_4UL>,_std::allocator<std::array<Tile,_4UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      }
      blockset = (Blockset *)
                 ((long)&(blockset->_blocks).
                         super__Vector_base<std::array<Tile,_4UL>,_std::allocator<std::array<Tile,_4UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_*,_std::vector<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>_>
    ::operator++(&__end1_1);
  }
  __end1_2 = std::
             vector<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>
             ::begin(&this->_blockset_groups);
  blockset_group_1 =
       (vector<Blockset_*,_std::allocator<Blockset_*>_> *)
       std::
       vector<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>
       ::end(&this->_blockset_groups);
  while( true ) {
    bVar3 = __gnu_cxx::
            operator==<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_*,_std::vector<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>_>
                      (&__end1_2,
                       (__normal_iterator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_*,_std::vector<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>_>
                        *)&blockset_group_1);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    this_01 = __gnu_cxx::
              __normal_iterator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_*,_std::vector<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>_>
              ::operator*(&__end1_2);
    sVar6 = std::vector<Blockset_*,_std::allocator<Blockset_*>_>::size(this_01);
    if (sVar6 == 1) {
      ppBVar7 = std::vector<Blockset_*,_std::allocator<Blockset_*>_>::operator[](this_01,0);
      pBVar1 = *ppBVar7;
      if (pBVar1 != (Blockset *)0x0) {
        Blockset::~Blockset(pBVar1);
        operator_delete(pBVar1,0x18);
      }
      std::vector<Blockset_*,_std::allocator<Blockset_*>_>::clear(this_01);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_*,_std::vector<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>_>
    ::operator++(&__end1_2);
  }
  std::set<Blockset_*,_std::less<Blockset_*>,_std::allocator<Blockset_*>_>::~set
            ((set<Blockset_*,_std::less<Blockset_*>,_std::allocator<Blockset_*>_> *)&__range1);
  return;
}

Assistant:

void World::clean_unused_blocksets()
{
    std::set<Blockset*> used_blocksets;
    for(auto& [id, map] : _maps)
        used_blocksets.insert(map->blockset());

    // Iterate over all secondary blocksets, and remove unused ones
    for(auto& blockset_group : _blockset_groups)
    {
        // Only start from one to exclude primary blocksets (which are never directly referenced)
        // Primary blocksets are removed only if all linked secondary blocksets are removed as well
        for(size_t j=1 ; j<blockset_group.size() ; ++j)
        {
            Blockset* blockset = blockset_group[j];
            if(!used_blocksets.count(blockset))
            {
                blockset_group.erase(blockset_group.begin() + (int)j);
                delete blockset;
                --j;
            }
        }
    }

    // Empty eventual blockset groups where only the primary blockset remains (no secondary blockset in the group)
    for(auto& blockset_group : _blockset_groups)
    {
        if(blockset_group.size() == 1)
        {
            delete blockset_group[0];
            blockset_group.clear();
        }
    }
}